

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_url_session.hpp
# Opt level: O2

void __thiscall
m2d::savanna::
async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>
::async_request_executor
          (async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>
           *this,request<get_yahoo_endpoint> *request,context *ssl_ctx,
          function<void_(m2d::savanna::result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>)>
          *completion)

{
  get_yahoo_endpoint *this_00;
  request<http::string_body> *this_01;
  __shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2> local_a8;
  function<void_(m2d::savanna::result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>)>
  *local_98;
  __shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
  local_90;
  __shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
  local_80;
  string local_70;
  string local_50;
  
  (this->
  super_enable_shared_from_this<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>_>
  )._M_weak_this.
  super___weak_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->
  super_enable_shared_from_this<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>_>
  )._M_weak_this.
  super___weak_ptr<m2d::savanna::async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_get_yahoo_endpoint>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->already_run_ = false;
  std::
  function<void_(m2d::savanna::result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>)>
  ::function(&this->completion_,completion);
  local_98 = &this->completion_;
  request<get_yahoo_endpoint>::request(&this->original_request_,request);
  this_01 = &this->request_;
  boost::beast::http::
  message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message(this_01);
  boost::beast::http::
  message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
  ::message(&this->response_);
  (this->buffer_).end_ = (char *)0x0;
  (this->buffer_).out_ = (char *)0x0;
  (this->buffer_).last_ = (char *)0x0;
  (this->buffer_).begin_ = (char *)0x0;
  (this->buffer_).in_ = (char *)0x0;
  (this->buffer_).max_ = 0x7fffffffffffffff;
  (this->ctx_).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ctx_).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->resolver_).
  super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->resolver_).
  super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->tcp_stream_).
  super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->tcp_stream_).
  super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ssl_stream_).
  super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->ssl_stream_).
  super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::make_shared<boost::asio::io_context>();
  std::__shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ctx_).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>,
             &local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::
  make_shared<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::io_context&>
            ((io_context *)&local_a8);
  std::
  __shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->resolver_).
               super___shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ,(__shared_ptr<boost::asio::ip::basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                *)&local_a8);
  std::
  make_shared<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>,boost::asio::io_context&>
            ((io_context *)&local_90);
  std::
  __shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->tcp_stream_).
               super___shared_ptr<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_90);
  std::
  make_shared<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,boost::asio::io_context&,boost::asio::ssl::context&>
            ((io_context *)&local_80,
             (context *)
             (this->ctx_).super___shared_ptr<boost::asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  std::
  __shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->ssl_stream_).
               super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  boost::beast::http::header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::
  version(&this_01->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>,
          (this->original_request_).version);
  local_a8._M_ptr = (element_type *)0x1aaad3;
  local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)this_01,user_agent,(string_view *)&local_a8);
  boost::beast::http::header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>::method
            (&this_01->super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>,
             get);
  this_00 = &(this->original_request_).endpoint;
  endpoint::build_url_str_abi_cxx11_(&local_50,(endpoint *)this_00);
  get_yahoo_endpoint::host_abi_cxx11_(&local_70,this_00);
  update_request(this,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

explicit async_request_executor(savanna::request<Endpoint> request, ssl::context &ssl_ctx, std::function<void(savanna::result<http::response<Body>>)> completion)
		    : completion_(completion)
		    , original_request_(request)
		{
			ctx_ = std::make_shared<net::io_context>();
			resolver_ = std::make_shared<tcp::resolver>(*ctx_),
			tcp_stream_ = std::make_shared<beast::tcp_stream>(*ctx_),
			ssl_stream_ = std::make_shared<beast::ssl_stream<beast::tcp_stream>>(*ctx_, ssl_ctx);

			request_.version(original_request_.version);
			request_.set(http::field::user_agent, BOOST_BEAST_VERSION_STRING);
			request_.method(original_request_.endpoint.method());
			update_request(original_request_.endpoint.build_url_str(), original_request_.endpoint.host());
		}